

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::SourceCodeInfo_Location::MergePartialFromCodedStream
          (SourceCodeInfo_Location *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  RepeatedField<int> *pRVar5;
  string *psVar6;
  char *pcVar7;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  SourceCodeInfo_Location *this_local;
  uint32 local_b0;
  uint32 local_7c;
  Limit local_78;
  int value_1;
  Limit limit_1;
  uint32 length_1;
  CodedInputStream *local_68;
  char local_5d;
  uint32 local_5c;
  uint32 *puStack_58;
  uint32 temp_1;
  CodedInputStream *local_50;
  undefined1 local_45;
  uint32 local_44;
  Limit local_40;
  int value;
  Limit limit;
  uint32 length;
  CodedInputStream *local_30;
  char local_25;
  uint32 local_24;
  uint32 *puStack_20;
  uint32 temp;
  CodedInputStream *local_18;
  undefined1 local_9;
  
LAB_00292057:
  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
    input->last_tag_ = (uint)*input->buffer_;
    io::CodedInputStream::Advance(input,1);
    local_b0 = input->last_tag_;
  }
  else {
    uVar2 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar2;
    local_b0 = input->last_tag_;
  }
  if (local_b0 == 0) {
    return true;
  }
  iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_b0);
  switch(iVar3) {
  case 1:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) {
      _limit = mutable_path(this);
      local_30 = input;
      bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value);
      if (bVar1) {
        local_40 = io::CodedInputStream::PushLimit(local_30,value);
        while (iVar3 = io::CodedInputStream::BytesUntilLimit(local_30), 0 < iVar3) {
          local_18 = local_30;
          puStack_20 = &local_44;
          local_9 = io::CodedInputStream::ReadVarint32(local_30,&local_24);
          if (!(bool)local_9) {
            local_25 = '\0';
            goto LAB_00292202;
          }
          *puStack_20 = local_24;
          RepeatedField<int>::Add(_limit,(int *)&local_44);
        }
        io::CodedInputStream::PopLimit(local_30,local_40);
        local_25 = '\x01';
      }
      else {
        local_25 = '\0';
      }
LAB_00292202:
      if (local_25 == '\0') {
        return false;
      }
    }
    else {
      WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
      if (WVar4 != WIRETYPE_VARINT) goto switchD_00292130_default;
      pRVar5 = mutable_path(this);
      bVar1 = internal::WireFormatLite::
              ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (1,10,input,pRVar5);
      if (!bVar1) {
        return false;
      }
    }
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (!bVar1) goto LAB_00292057;
LAB_00292399:
    _limit_1 = mutable_span(this);
    local_68 = input;
    bVar1 = io::CodedInputStream::ReadVarint32(input,(uint32 *)&value_1);
    if (bVar1) {
      local_78 = io::CodedInputStream::PushLimit(local_68,value_1);
      while (iVar3 = io::CodedInputStream::BytesUntilLimit(local_68), 0 < iVar3) {
        local_50 = local_68;
        puStack_58 = &local_7c;
        local_45 = io::CodedInputStream::ReadVarint32(local_68,&local_5c);
        if (!(bool)local_45) {
          local_5d = '\0';
          goto LAB_00292455;
        }
        *puStack_58 = local_5c;
        RepeatedField<int>::Add(_limit_1,(int *)&local_7c);
      }
      io::CodedInputStream::PopLimit(local_68,local_78);
      local_5d = '\x01';
    }
    else {
      local_5d = '\0';
    }
LAB_00292455:
    if (local_5d == '\0') {
      return false;
    }
    break;
  case 2:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_00292399;
    WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
    if (WVar4 != WIRETYPE_VARINT) goto switchD_00292130_default;
    pRVar5 = mutable_span(this);
    bVar1 = internal::WireFormatLite::
            ReadRepeatedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (1,0x12,input,pRVar5);
    if (!bVar1) {
      return false;
    }
    break;
  case 3:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) goto switchD_00292130_default;
    goto LAB_00292600;
  case 4:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) goto switchD_00292130_default;
    goto LAB_002927ba;
  default:
    goto switchD_00292130_default;
  }
  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
    io::CodedInputStream::Advance(input,1);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (bVar1) {
LAB_00292600:
    psVar6 = mutable_leading_comments_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
    if (!bVar1) {
      return false;
    }
    leading_comments_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    leading_comments_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar7,iVar3,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_002927ba:
      psVar6 = mutable_trailing_comments_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar6);
      if (!bVar1) {
        return false;
      }
      trailing_comments_abi_cxx11_(this);
      pcVar7 = (char *)std::__cxx11::string::data();
      trailing_comments_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar7,iVar3,PARSE);
      bVar1 = io::CodedInputStream::ExpectAtEnd(input);
      if (bVar1) {
        return true;
      }
    }
  }
  goto LAB_00292057;
switchD_00292130_default:
  WVar4 = internal::WireFormatLite::GetTagWireType(local_b0);
  if (WVar4 == WIRETYPE_END_GROUP) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar1 = internal::WireFormat::SkipField(input,local_b0,unknown_fields);
  if (!bVar1) {
    return false;
  }
  goto LAB_00292057;
}

Assistant:

bool SourceCodeInfo_Location::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int32 path = 1 [packed = true];
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_path())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 10, input, this->mutable_path())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_span;
        break;
      }

      // repeated int32 span = 2 [packed = true];
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_span:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, this->mutable_span())));
        } else if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag)
                   == ::google::protobuf::internal::WireFormatLite::
                      WIRETYPE_VARINT) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 1, 18, input, this->mutable_span())));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_leading_comments;
        break;
      }

      // optional string leading_comments = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_leading_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_leading_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->leading_comments().data(), this->leading_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_trailing_comments;
        break;
      }

      // optional string trailing_comments = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_trailing_comments:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_trailing_comments()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->trailing_comments().data(), this->trailing_comments().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}